

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormulaTransformer.cpp
# Opt level: O0

Formula * __thiscall
Kernel::PolarityAwareFormulaTransformer::applyImp(PolarityAwareFormulaTransformer *this,Formula *f)

{
  Connective con;
  BinaryFormula *pBVar1;
  Formula *pFVar2;
  BinaryFormula *pBVar3;
  Formula *pFVar4;
  Formula *in_RSI;
  long in_RDI;
  Formula *newRight;
  ScopedLet<int> plet;
  Formula *newLeft;
  Formula *in_stack_ffffffffffffff78;
  BinaryFormula *in_stack_ffffffffffffff90;
  Formula *in_stack_ffffffffffffffc0;
  FormulaTransformer *in_stack_ffffffffffffffc8;
  ScopedLet<int> local_30;
  Formula *local_20;
  Formula *local_18;
  
  local_18 = in_RSI;
  Lib::ScopedLet<int>::ScopedLet(&local_30,(int *)(in_RDI + 0x18),-*(int *)(in_RDI + 0x18));
  Formula::left((Formula *)0x8592fb);
  local_20 = FormulaTransformer::apply(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
  Lib::ScopedLet<int>::~ScopedLet(&local_30);
  Formula::right((Formula *)0x859336);
  pBVar1 = (BinaryFormula *)
           FormulaTransformer::apply(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
  pFVar4 = local_20;
  pFVar2 = Formula::left((Formula *)0x85935c);
  if ((pFVar4 == pFVar2) &&
     (pBVar3 = (BinaryFormula *)Formula::right((Formula *)0x85937d),
     in_stack_ffffffffffffff90 = pBVar1, pBVar1 == pBVar3)) {
    return local_18;
  }
  pFVar4 = (Formula *)BinaryFormula::operator_new(0x8593c0);
  con = Formula::connective(local_18);
  BinaryFormula::BinaryFormula(in_stack_ffffffffffffff90,con,pFVar4,in_stack_ffffffffffffff78);
  return pFVar4;
}

Assistant:

Formula* PolarityAwareFormulaTransformer::applyImp(Formula* f)
{
  ASS_EQ(f->connective(),IMP);

  Formula* newLeft;
  {
    ScopedLet<int> plet(_polarity, -_polarity);
    newLeft = apply(f->left());
  }
  Formula* newRight = apply(f->right());
  if(newLeft==f->left() && newRight==f->right()) {
    return f;
  }
  return new BinaryFormula(f->connective(), newLeft, newRight);
}